

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

void google::protobuf::internal::WireFormat::SerializeWithCachedSizes
               (Message *message,int size,CodedOutputStream *output)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnknownFieldSet *pUVar5;
  LogMessage *pLVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  LogFinisher local_89;
  FieldDescriptor **local_88;
  iterator iStack_80;
  FieldDescriptor **local_78;
  long *local_70;
  LogMessage local_68;
  long lVar4;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  local_70 = (long *)CONCAT44(extraout_var_00,iVar2);
  iVar2 = output->total_bytes_;
  iVar1 = output->buffer_size_;
  local_88 = (FieldDescriptor **)0x0;
  iStack_80._M_current = (FieldDescriptor **)0x0;
  local_78 = (FieldDescriptor **)0x0;
  if (*(char *)(*(long *)(lVar4 + 0x20) + 0x6b) == '\x01') {
    iVar3 = *(int *)(lVar4 + 0x2c);
    if (0 < iVar3) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        local_68._0_8_ = *(long *)(lVar4 + 0x30) + lVar7;
        if (iStack_80._M_current == local_78) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&local_88,iStack_80,(FieldDescriptor **)&local_68);
          iVar3 = *(int *)(lVar4 + 0x2c);
        }
        else {
          *iStack_80._M_current = (FieldDescriptor *)local_68._0_8_;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0xa8;
      } while (lVar8 < iVar3);
    }
  }
  else {
    (**(code **)(*local_70 + 0x80))(local_70,message,&local_88);
  }
  if (iStack_80._M_current != local_88) {
    uVar9 = 0;
    do {
      SerializeFieldWithCachedSizes(local_88[uVar9],message,output);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 3));
  }
  if (*(char *)(*(long *)(lVar4 + 0x20) + 0x68) == '\0') {
    pUVar5 = (UnknownFieldSet *)(**(code **)(*local_70 + 0x10))(local_70,message);
    SerializeUnknownFields(pUVar5,output);
  }
  else {
    pUVar5 = (UnknownFieldSet *)(**(code **)(*local_70 + 0x10))(local_70,message);
    SerializeUnknownMessageSetItems(pUVar5,output);
  }
  if (output->total_bytes_ - output->buffer_size_ != (size + iVar2) - iVar1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x33e);
    pLVar6 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (output->ByteCount()) == (expected_endpoint): ");
    pLVar6 = LogMessage::operator<<
                       (pLVar6,
                        ": Protocol message serialized to a size different from what was originally expected.  Perhaps it was modified by another thread during serialization?"
                       );
    LogFinisher::operator=(&local_89,pLVar6);
    LogMessage::~LogMessage(&local_68);
  }
  if (local_88 != (FieldDescriptor **)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return;
}

Assistant:

void WireFormat::SerializeWithCachedSizes(
    const Message& message,
    int size, io::CodedOutputStream* output) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();
  int expected_endpoint = output->ByteCount() + size;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (int i = 0; i < fields.size(); i++) {
    SerializeFieldWithCachedSizes(fields[i], message, output);
  }

  if (descriptor->options().message_set_wire_format()) {
    SerializeUnknownMessageSetItems(
        message_reflection->GetUnknownFields(message), output);
  } else {
    SerializeUnknownFields(
        message_reflection->GetUnknownFields(message), output);
  }

  GOOGLE_CHECK_EQ(output->ByteCount(), expected_endpoint)
    << ": Protocol message serialized to a size different from what was "
       "originally expected.  Perhaps it was modified by another thread "
       "during serialization?";
}